

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint
          (btGeneric6DofSpring2Constraint *this,btRigidBody *rbB,btTransform *frameInB,
          RotateOrder rotOrder)

{
  btTransform *pbVar1;
  btGeneric6DofSpring2Constraint *this_00;
  undefined4 in_ECX;
  btTransform *this_01;
  btVector3 *pbVar2;
  btRigidBody *in_RSI;
  undefined8 *in_RDI;
  btRigidBody *in_stack_ffffffffffffff18;
  btRigidBody *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  btTypedConstraintType type;
  btTypedConstraint *in_stack_ffffffffffffff30;
  btVector3 *local_c8;
  btRotationalLimitMotor2 *local_b0;
  undefined8 *local_98;
  btTransform *local_80;
  btTranslationalLimitMotor2 *in_stack_ffffffffffffffa0;
  
  type = (btTypedConstraintType)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  btTypedConstraint::getFixedBody();
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff30,type,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *in_RDI = &PTR__btGeneric6DofSpring2Constraint_002e71c0;
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff20,(btTransform *)in_stack_ffffffffffffff18);
  this_01 = (btTransform *)((long)in_RDI + 0x1c4);
  pbVar1 = (btTransform *)(in_RDI + 0x19);
  do {
    local_80 = pbVar1;
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff20);
    pbVar1 = (btTransform *)(local_80[1].m_basis.m_el[1].m_floats + 1);
  } while (pbVar1 != this_01);
  local_98 = (undefined8 *)((long)in_RDI + 0x1c4);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff20);
    local_98 = (undefined8 *)((long)local_98 + 0x54);
  } while (local_98 != in_RDI + 0x58);
  btTranslationalLimitMotor2::btTranslationalLimitMotor2(in_stack_ffffffffffffffa0);
  local_b0 = (btRotationalLimitMotor2 *)(in_RDI + 0x7c);
  do {
    btRotationalLimitMotor2::btRotationalLimitMotor2(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (btRotationalLimitMotor2 *)(in_RDI + 0x9d));
  *(undefined4 *)(in_RDI + 0x9d) = in_ECX;
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x56c));
  local_c8 = (btVector3 *)((long)in_RDI + 0x57c);
  pbVar2 = (btVector3 *)((long)in_RDI + 0x5ac);
  do {
    btVector3::btVector3(local_c8);
    local_c8 = local_c8 + 1;
  } while (local_c8 != pbVar2);
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x5ac));
  *(undefined4 *)(in_RDI + 0xb9) = 0;
  this_00 = (btGeneric6DofSpring2Constraint *)btRigidBody::getCenterOfMassTransform(in_RSI);
  btTransform::operator*(this_01,local_80);
  btTransform::operator=((btTransform *)this_00,(btTransform *)in_stack_ffffffffffffff18);
  calculateTransforms(this_00);
  return;
}

Assistant:

btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint(btRigidBody& rbB, const btTransform& frameInB, RotateOrder rotOrder)
	: btTypedConstraint(D6_SPRING_2_CONSTRAINT_TYPE, getFixedBody(), rbB)
	, m_frameInB(frameInB)
	, m_rotateOrder(rotOrder)
	, m_flags(0)
{
	///not providing rigidbody A means implicitly using worldspace for body A
	m_frameInA = rbB.getCenterOfMassTransform() * m_frameInB;
	calculateTransforms();
}